

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O1

bool __thiscall EOPlus::Context::CheckRules(Context *this)

{
  State *pSVar1;
  _Elt_pointer pRVar2;
  pointer pcVar3;
  runtime_error *this_00;
  int iVar4;
  _Map_pointer ppRVar5;
  _Elt_pointer pRVar6;
  _Elt_pointer __x;
  bool bVar7;
  Rule rule;
  undefined1 local_278 [80];
  _Alloc_hider local_228;
  char local_218 [16];
  deque<util::variant,_std::allocator<util::variant>_> local_208;
  Action local_1b8;
  
  pSVar1 = this->state;
  if (pSVar1 == (State *)0x0) {
    if (this->finished == false) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"No state selected");
      goto LAB_001398e1;
    }
  }
  else {
    iVar4 = recursive_depth + 1;
    if (100 < iVar4) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Quest action recursion too deep");
LAB_001398e1:
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    __x = (pSVar1->rules).super__Deque_base<EOPlus::Rule,_std::allocator<EOPlus::Rule>_>._M_impl.
          super__Deque_impl_data._M_start._M_cur;
    pRVar2 = (pSVar1->rules).super__Deque_base<EOPlus::Rule,_std::allocator<EOPlus::Rule>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    bVar7 = __x == pRVar2;
    recursive_depth = iVar4;
    if (!bVar7) {
      pRVar6 = (pSVar1->rules).super__Deque_base<EOPlus::Rule,_std::allocator<EOPlus::Rule>_>.
               _M_impl.super__Deque_impl_data._M_start._M_last;
      ppRVar5 = (pSVar1->rules).super__Deque_base<EOPlus::Rule,_std::allocator<EOPlus::Rule>_>.
                _M_impl.super__Deque_impl_data._M_start._M_node;
      do {
        std::deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>::deque
                  ((deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_> *)local_278,
                   (deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_> *)__x);
        local_228._M_p = local_218;
        pcVar3 = (__x->expr).function._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_228,pcVar3,pcVar3 + (__x->expr).function._M_string_length);
        std::deque<util::variant,_std::allocator<util::variant>_>::deque
                  (&local_208,&(__x->expr).args);
        Action::Action(&local_1b8,&__x->action);
        iVar4 = (*this->_vptr_Context[2])(this,(Rule *)local_278);
        if (((char)iVar4 != '\0') &&
           (iVar4 = (*this->_vptr_Context[1])(this,&local_1b8), (char)iVar4 != '\0')) {
          recursive_depth = recursive_depth + -1;
          Rule::~Rule((Rule *)local_278);
          if (!bVar7) {
            return true;
          }
          break;
        }
        Rule::~Rule((Rule *)local_278);
        __x = __x + 1;
        if (__x == pRVar6) {
          __x = ppRVar5[1];
          ppRVar5 = ppRVar5 + 1;
          pRVar6 = __x + 1;
        }
        bVar7 = __x == pRVar2;
      } while (!bVar7);
    }
    recursive_depth = recursive_depth + -1;
  }
  return false;
}

Assistant:

bool Context::CheckRules()
	{
		if (!this->state)
		{
			if (this->finished)
				return false;
			else
				throw std::runtime_error("No state selected");
		}

		if (++recursive_depth > max_recursion)
		{
			--recursive_depth;
			throw std::runtime_error("Quest action recursion too deep");
		}

		try
		{
			UTIL_FOREACH(this->state->rules, rule)
			{
				if (this->CheckRule(rule.expr))
				{
					if (this->DoAction(rule.action))
					{
						// *this may not be valid here
						--recursive_depth;
						return true;
					}
				}
			}
		}
		catch (...)
		{
			--recursive_depth;
			throw;
		}

		--recursive_depth;

		return false;
	}